

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void CPP::WriteInitialization::addInitializer
               (Item *item,QString *name,int column,QString *value,QString *directive,
               bool translatable)

{
  char16_t *pcVar1;
  QChar QVar2;
  CutResult CVar3;
  QTextStream *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QString local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((value->d).size != 0) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_78,&local_68,3);
    pQVar4 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_78,(QString *)&language::derefPointer);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"set");
    QVar2.ucs = QChar::toUpper((uint)(ushort)*(name->d).ptr);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,QVar2);
    pcVar1 = (name->d).ptr;
    local_40 = 1;
    local_48 = -1;
    CVar3 = QtPrivate::QContainerImplHelper::mid((name->d).size,&local_40,&local_48);
    pcVar5 = (char16_t *)0x0;
    qVar6 = 0;
    if (CVar3 != Null) {
      pcVar5 = pcVar1 + local_40;
      qVar6 = local_48;
    }
    QVar7.m_data = pcVar5;
    QVar7.m_size = qVar6;
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,QVar7);
    QTextStream::operator<<(pQVar4,'(');
    if (-1 < column) {
      pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_78,column);
      QTextStream::operator<<(pQVar4,", ");
    }
    pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_78,value);
    QTextStream::operator<<(pQVar4,");");
    Item::addSetter(item,&local_68,directive,translatable);
    QTextStream::~QTextStream((QTextStream *)&local_78);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addInitializer(Item *item, const QString &name,
                                         int column, const QString &value,
                                         const QString &directive, bool translatable)
{
    if (!value.isEmpty()) {
        QString setter;
        QTextStream str(&setter);
        str << language::derefPointer << "set" << name.at(0).toUpper() << QStringView{name}.mid(1) << '(';
        if (column >= 0)
            str << column << ", ";
        str << value << ");";
        item->addSetter(setter, directive, translatable);
    }
}